

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicInstanceBase::BinaryAtomicInstanceBase
          (BinaryAtomicInstanceBase *this,Context *context,string *name,ImageType imageType,
          UVec3 *imageSize,TextureFormat *format,AtomicOperation operation)

{
  TextureFormat *format_local;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  string *name_local;
  Context *context_local;
  BinaryAtomicInstanceBase *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BinaryAtomicInstanceBase_016af2b0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_imageType = imageType;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_imageSize,imageSize);
  this->m_format = *format;
  this->m_operation = operation;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            (&this->m_outputBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            (&this->m_resultImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_resultImageView);
  return;
}

Assistant:

BinaryAtomicInstanceBase::BinaryAtomicInstanceBase (Context&				context,
													const string&			name,
													const ImageType			imageType,
													const tcu::UVec3&		imageSize,
													const TextureFormat&	format,
													const AtomicOperation	operation)
	: vkt::TestInstance	(context)
	, m_name			(name)
	, m_imageType		(imageType)
	, m_imageSize		(imageSize)
	, m_format			(format)
	, m_operation		(operation)
{
}